

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
::dx(FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  Fad<double> *pFVar3;
  Fad<double> *pFVar4;
  double *pdVar5;
  value_type vVar6;
  
  pFVar3 = (this->left_->fadexpr_).right_;
  pFVar4 = (((this->left_->fadexpr_).left_)->fadexpr_).right_;
  pdVar5 = &pFVar4->defaultVal;
  if ((pFVar4->dx_).num_elts != 0) {
    pdVar5 = (pFVar4->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar5;
  pdVar5 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar5 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar2 = *pdVar5;
  vVar6 = FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  return vVar6 + dVar1 + dVar2;
}

Assistant:

const value_type dx(int i) const {return left_.dx(i) + right_.dx(i);}